

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void writeHorizontal(double **U,int sizeX,int sizeY,char *fileName)

{
  FILE *__stream;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int j;
  FILE *out;
  int local_24;
  
  __stream = fopen(in_RCX,"w");
  fprintf(__stream,"[");
  for (local_24 = 1; local_24 <= in_EDX; local_24 = local_24 + 1) {
    fprintf(__stream,"%g,",
            *(undefined8 *)(*(long *)(in_RDI + (long)(in_ESI / 2 + 2) * 8) + (long)local_24 * 8),
            (long)in_ESI % 2 & 0xffffffff);
  }
  fprintf(__stream,"]");
  fclose(__stream);
  return;
}

Assistant:

void writeHorizontal (REAL **U, int sizeX, int sizeY, char *fileName)
{
	FILE *out = fopen(fileName,"w");
	fprintf(out,"[");
	for (int j = 1; j <= sizeY; j++)
		fprintf(out,"%g,",U[2+sizeX/2][j]);
	fprintf(out,"]");
	fclose(out);
	return;
}